

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_51301::StringExpr::dump(StringExpr *this)

{
  pointer pcVar1;
  pointer pcVar2;
  
  fputc(0x22,_stderr);
  pcVar1 = (this->characters).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar2 = (this->characters).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                super__Vector_impl_data._M_start; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    fputc((int)(char)*pcVar2,_stderr);
  }
  fputc(0x22,_stderr);
  return;
}

Assistant:

void StringExpr::dump() const
{
	fprintf(stderr, "\"");
	for (char32_t c : characters)
	{
		fprintf(stderr, "%c", static_cast<char>(c));
	}
	fprintf(stderr, "\"");
}